

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::InternalSwap
          (CodeGeneratorRequest *this,CodeGeneratorRequest *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  uint32_t *__a;
  uint32_t *__b;
  string *default_value;
  Arena *rhs_arena;
  Arena *lhs_arena;
  CodeGeneratorRequest *other_local;
  CodeGeneratorRequest *this_local;
  
  rhs_arena_00 = MessageLite::GetArenaForAllocation((MessageLite *)this);
  lhs_arena_00 = MessageLite::GetArenaForAllocation((MessageLite *)other);
  internal::InternalMetadata::InternalSwap
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(other->super_Message).super_MessageLite._internal_metadata_);
  __a = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  __b = internal::HasBits<1UL>::operator[](&other->_has_bits_,0);
  std::swap<unsigned_int>(__a,__b);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap(&this->file_to_generate_,&other->file_to_generate_);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::InternalSwap
            (&this->proto_file_,&other->proto_file_);
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::InternalSwap
            (default_value,&this->parameter_,rhs_arena_00,&other->parameter_,lhs_arena_00);
  std::swap<google::protobuf::compiler::Version*>
            (&this->compiler_version_,&other->compiler_version_);
  return;
}

Assistant:

void CodeGeneratorRequest::InternalSwap(CodeGeneratorRequest* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  file_to_generate_.InternalSwap(&other->file_to_generate_);
  proto_file_.InternalSwap(&other->proto_file_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &parameter_, lhs_arena,
      &other->parameter_, rhs_arena
  );
  swap(compiler_version_, other->compiler_version_);
}